

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall sjtu::vector<sjtu::recordType>::doubleSpace(vector<sjtu::recordType> *this)

{
  int iVar1;
  recordType *prVar2;
  recordType *prVar3;
  ulong uVar4;
  int i;
  long lVar5;
  recordType *p;
  long lVar6;
  
  prVar2 = this->data;
  iVar1 = this->maxSize;
  this->maxSize = iVar1 * 2;
  prVar3 = (recordType *)operator_new((long)iVar1 * 0x120);
  this->data = prVar3;
  lVar6 = 0;
  for (lVar5 = 0; uVar4 = (ulong)this->currentLength, prVar3 = prVar2, lVar5 < (long)uVar4;
      lVar5 = lVar5 + 1) {
    recordType::recordType
              ((recordType *)
               ((long)&(((recordType *)(this->data->station + -1))->trainID)._M_dataplus._M_p +
               lVar6),(recordType *)
                      ((long)&(((recordType *)(prVar2->station + -1))->trainID)._M_dataplus._M_p +
                      lVar6));
    lVar6 = lVar6 + 0x90;
  }
  for (; prVar3 < prVar2 + (int)uVar4; prVar3 = prVar3 + 1) {
    recordType::~recordType(prVar3);
    uVar4 = (ulong)(uint)this->currentLength;
  }
  operator_delete(prVar2);
  return;
}

Assistant:

void doubleSpace() {
                T *tmp = data;
                maxSize *= 2;
                data = (T*) (operator new (maxSize * sizeof(T)));
                for (int i = 0; i < currentLength; ++i)
                        new (data + i) T(tmp[i]);
        for (T* p = tmp; p < tmp + currentLength; ++p)
            p->~T();
                operator delete (tmp);
        }